

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleLightNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  pointer ppaVar1;
  aiLight *this_00;
  aiNode *this_01;
  aiLight *light;
  aiLight *local_30;
  
  this_00 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(this_00);
  local_30 = this_00;
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back(&this->m_lightCache,&local_30);
  this->m_currentLight = local_30;
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  this->m_tokenType = 7;
  this->m_currentNode = this_01;
  pushNode(this,this_01,pScene);
  handleNodes(this,node,pScene);
  ppaVar1 = (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppaVar1) {
    (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar1 + -1;
  }
  aiString::Set(&this->m_currentLight->mName,(this_01->mName).data);
  return;
}

Assistant:

void OpenGEXImporter::handleLightNode( ODDLParser::DDLNode *node, aiScene *pScene ) {
    aiLight *light( new aiLight );
    m_lightCache.push_back( light );
    m_currentLight = light;

    aiNode *newNode = new aiNode;
    m_tokenType = Grammar::LightNodeToken;
    m_currentNode = newNode;
    pushNode( newNode, pScene );

    handleNodes( node, pScene );

    popNode();

    m_currentLight->mName.Set( newNode->mName.C_Str() );
}